

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMDocumentImpl::deleteHeap(DOMDocumentImpl *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)this->fCurrentBlock;
  while (puVar1 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*puVar1;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    this->fCurrentBlock = puVar1;
  }
  puVar1 = (undefined8 *)this->fCurrentSingletonBlock;
  while (puVar1 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*puVar1;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    this->fCurrentSingletonBlock = puVar1;
  }
  return;
}

Assistant:

void DOMDocumentImpl::deleteHeap()
{
    while (fCurrentBlock != 0)
    {
        void *nextBlock = *(void **)fCurrentBlock;
        fMemoryManager->deallocate(fCurrentBlock);
        fCurrentBlock = nextBlock;
    }
    while (fCurrentSingletonBlock != 0)
    {
        void *nextBlock = *(void **)fCurrentSingletonBlock;
        fMemoryManager->deallocate(fCurrentSingletonBlock);
        fCurrentSingletonBlock = nextBlock;
    }
}